

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundColumnRefExpression::Serialize(BoundColumnRefExpression *this,Serializer *serializer)

{
  Expression::Serialize(&this->super_Expression,serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,200,"return_type",&(this->super_Expression).return_type);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"binding");
  Serializer::WriteValue<duckdb::ColumnBinding>(serializer,&this->binding);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<unsigned_long>(serializer,0xca,"depth",&this->depth);
  return;
}

Assistant:

void BoundColumnRefExpression::Serialize(Serializer &serializer) const {
	Expression::Serialize(serializer);
	serializer.WriteProperty<LogicalType>(200, "return_type", return_type);
	serializer.WriteProperty<ColumnBinding>(201, "binding", binding);
	serializer.WritePropertyWithDefault<idx_t>(202, "depth", depth);
}